

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionModel.cpp
# Opt level: O2

void __thiscall
chrono::collision::ChCollisionModel::ArchiveIN(ChCollisionModel *this,ChArchiveIn *marchive)

{
  ChNameValue<float> local_48;
  ChNameValue<float> local_30;
  
  ChArchiveIn::VersionRead<chrono::collision::ChCollisionModel>(marchive);
  local_30._value = &this->model_envelope;
  local_30._name = "model_envelope";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->model_safe_margin;
  local_48._name = "model_safe_margin";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  return;
}

Assistant:

void ChCollisionModel::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChCollisionModel>();

    // stream in all member data:
    marchive >> CHNVP(model_envelope);
    marchive >> CHNVP(model_safe_margin);
}